

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_util.c
# Opt level: O0

void ossl_prov_digest_reset(PROV_DIGEST *pd)

{
  undefined8 *in_RDI;
  
  EVP_MD_free((EVP_MD *)pd);
  in_RDI[1] = 0;
  *in_RDI = 0;
  ENGINE_finish((ENGINE *)in_RDI[2]);
  in_RDI[2] = 0;
  return;
}

Assistant:

void ossl_prov_digest_reset(PROV_DIGEST *pd)
{
    EVP_MD_free(pd->alloc_md);
    pd->alloc_md = NULL;
    pd->md = NULL;
#if !defined(FIPS_MODULE) && !defined(OPENSSL_NO_ENGINE)
    ENGINE_finish(pd->engine);
#endif
    pd->engine = NULL;
}